

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool __thiscall
cmStringCommand::HandleRandomCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  bool bVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  const_reference pvVar6;
  char *pcVar7;
  ulong uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  uint local_194;
  value_type local_161;
  int local_160;
  int local_15c;
  int idx;
  int cc;
  char *alphaPtr;
  vector<char,_std::allocator<char>_> result;
  string *variableName;
  string local_128;
  undefined4 local_108;
  allocator<char> local_101;
  string local_100;
  double local_e0;
  double sizeofAlphabet;
  size_t stopAt;
  size_t i;
  string alphabet;
  char cmStringCommandDefaultAlphabet [63];
  int local_60;
  uint local_5c;
  int length;
  uint seed;
  bool force_seed;
  allocator<char> local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmStringCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (((sVar5 < 2) ||
      (sVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(local_20), sVar5 == 3)) ||
     (sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_20), sVar5 == 5)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"sub-command RANDOM requires at least one argument.",&local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local._7_1_ = 0;
  }
  else {
    bVar1 = false;
    local_5c = 0;
    local_60 = 5;
    memcpy((void *)((long)&alphabet.field_2 + 8),
           "qwertyuiopasdfghjklzxcvbnmQWERTYUIOPASDFGHJKLZXCVBNM0123456789",0x3f);
    std::__cxx11::string::string((string *)&i);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_20);
    if (3 < sVar5) {
      stopAt = 1;
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_20);
      sizeofAlphabet = (double)(sVar5 - 2);
      for (; stopAt < (ulong)sizeofAlphabet; stopAt = stopAt + 1) {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_20,stopAt);
        bVar3 = std::operator==(pvVar6,"LENGTH");
        if (bVar3) {
          stopAt = stopAt + 1;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](local_20,stopAt);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          local_60 = atoi(pcVar7);
        }
        else {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](local_20,stopAt);
          bVar3 = std::operator==(pvVar6,"ALPHABET");
          if (bVar3) {
            stopAt = stopAt + 1;
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](local_20,stopAt);
            std::__cxx11::string::operator=((string *)&i,(string *)pvVar6);
          }
          else {
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](local_20,stopAt);
            bVar3 = std::operator==(pvVar6,"RANDOM_SEED");
            if (bVar3) {
              stopAt = stopAt + 1;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](local_20,stopAt);
              pcVar7 = (char *)std::__cxx11::string::c_str();
              local_5c = atoi(pcVar7);
              bVar1 = true;
            }
          }
        }
      }
    }
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) != 0) {
      std::__cxx11::string::operator=((string *)&i,alphabet.field_2._M_local_buf + 8);
    }
    uVar9 = std::__cxx11::string::size();
    auVar10._8_4_ = (int)((ulong)uVar9 >> 0x20);
    auVar10._0_8_ = uVar9;
    auVar10._12_4_ = 0x45300000;
    local_e0 = (auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0);
    if (1.0 <= local_e0) {
      if (local_60 < 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_128,"sub-command RANDOM invoked with bad length.",
                   (allocator<char> *)((long)&variableName + 7));
        cmCommand::SetError(&this->super_cmCommand,&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        std::allocator<char>::~allocator((allocator<char> *)((long)&variableName + 7));
        this_local._7_1_ = 0;
        local_108 = 1;
      }
      else {
        result.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back(local_20);
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)&alphaPtr);
        if (((HandleRandomCommand::seeded & 1U) == 0) || (bVar1)) {
          HandleRandomCommand::seeded = true;
          if (bVar1) {
            local_194 = local_5c;
          }
          else {
            local_194 = cmSystemTools::RandomSeed();
          }
          srand(local_194);
        }
        _idx = std::__cxx11::string::c_str();
        for (local_15c = 0; dVar2 = local_e0, local_15c < local_60; local_15c = local_15c + 1) {
          iVar4 = rand();
          local_160 = (int)(dVar2 * (double)iVar4 * 4.656612873077393e-10);
          std::vector<char,_std::allocator<char>_>::push_back
                    ((vector<char,_std::allocator<char>_> *)&alphaPtr,
                     (value_type *)(_idx + local_160));
        }
        local_161 = '\0';
        std::vector<char,_std::allocator<char>_>::push_back
                  ((vector<char,_std::allocator<char>_> *)&alphaPtr,&local_161);
        uVar9 = result.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_;
        this_00 = (this->super_cmCommand).Makefile;
        pcVar7 = std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)&alphaPtr);
        cmMakefile::AddDefinition(this_00,(string *)uVar9,pcVar7);
        this_local._7_1_ = 1;
        local_108 = 1;
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)&alphaPtr);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"sub-command RANDOM invoked with bad alphabet.",&local_101);
      cmCommand::SetError(&this->super_cmCommand,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator(&local_101);
      this_local._7_1_ = 0;
      local_108 = 1;
    }
    std::__cxx11::string::~string((string *)&i);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmStringCommand::HandleRandomCommand(std::vector<std::string> const& args)
{
  if (args.size() < 2 || args.size() == 3 || args.size() == 5) {
    this->SetError("sub-command RANDOM requires at least one argument.");
    return false;
  }

  static bool seeded = false;
  bool force_seed = false;
  unsigned int seed = 0;
  int length = 5;
  const char cmStringCommandDefaultAlphabet[] = "qwertyuiopasdfghjklzxcvbnm"
                                                "QWERTYUIOPASDFGHJKLZXCVBNM"
                                                "0123456789";
  std::string alphabet;

  if (args.size() > 3) {
    size_t i = 1;
    size_t stopAt = args.size() - 2;

    for (; i < stopAt; ++i) {
      if (args[i] == "LENGTH") {
        ++i;
        length = atoi(args[i].c_str());
      } else if (args[i] == "ALPHABET") {
        ++i;
        alphabet = args[i];
      } else if (args[i] == "RANDOM_SEED") {
        ++i;
        seed = static_cast<unsigned int>(atoi(args[i].c_str()));
        force_seed = true;
      }
    }
  }
  if (alphabet.empty()) {
    alphabet = cmStringCommandDefaultAlphabet;
  }

  double sizeofAlphabet = static_cast<double>(alphabet.size());
  if (sizeofAlphabet < 1) {
    this->SetError("sub-command RANDOM invoked with bad alphabet.");
    return false;
  }
  if (length < 1) {
    this->SetError("sub-command RANDOM invoked with bad length.");
    return false;
  }
  const std::string& variableName = args.back();

  std::vector<char> result;

  if (!seeded || force_seed) {
    seeded = true;
    srand(force_seed ? seed : cmSystemTools::RandomSeed());
  }

  const char* alphaPtr = alphabet.c_str();
  for (int cc = 0; cc < length; cc++) {
    int idx = static_cast<int>(sizeofAlphabet * rand() / (RAND_MAX + 1.0));
    result.push_back(*(alphaPtr + idx));
  }
  result.push_back(0);

  this->Makefile->AddDefinition(variableName, result.data());
  return true;
}